

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend_openssl.cpp
# Opt level: O3

void q_loadCiphersForConnection
               (SSL *connection,QList<QSslCipher> *ciphers,QList<QSslCipher> *defaultCiphers)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  stack_st_SSL_CIPHER *a;
  SSL_CIPHER *cipher;
  long in_FS_OFFSET;
  QLatin1String QVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QSslCipher ciph;
  QArrayData *local_d0;
  QString local_b8;
  QArrayData *local_a0;
  QString local_88;
  QArrayData *local_70;
  QString local_58;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  a = q_SSL_get_ciphers(connection);
  iVar3 = q_OPENSSL_sk_num((OPENSSL_STACK *)a);
  if (0 < iVar3) {
    iVar3 = 0;
    do {
      cipher = (SSL_CIPHER *)q_OPENSSL_sk_value((OPENSSL_STACK *)a,iVar3);
      if (cipher != (SSL_CIPHER *)0x0) {
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        QTlsBackendOpenSSL::qt_OpenSSL_cipher_to_QSslCipher((QTlsBackendOpenSSL *)&local_40,cipher);
        cVar1 = QSslCipher::isNull();
        if (cVar1 == '\0') {
          QSslCipher::name();
          QString::toLower_helper(&local_58);
          QVar5.m_data = (char *)0x3;
          QVar5.m_size = (qsizetype)&local_58;
          cVar1 = QString::startsWith(QVar5,0x13b5ab);
          if (cVar1 == '\0') {
            QSslCipher::name();
            QString::toLower_helper(&local_88);
            QVar6.m_data = (char *)0x7;
            QVar6.m_size = (qsizetype)&local_88;
            cVar1 = QString::startsWith(QVar6,0x13b5a7);
            if (cVar1 == '\0') {
              QSslCipher::name();
              QString::toLower_helper(&local_b8);
              QVar7.m_data = (char *)0x5;
              QVar7.m_size = (qsizetype)&local_b8;
              bVar2 = QString::startsWith(QVar7,0x13b5af);
              if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (local_d0 != (QArrayData *)0x0) {
                LOCK();
                (local_d0->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_d0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_d0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_d0,2,0x10);
                }
              }
              bVar2 = bVar2 ^ 1;
            }
            else {
              bVar2 = 0;
            }
            if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (local_a0 != (QArrayData *)0x0) {
              LOCK();
              (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_a0,2,0x10);
              }
            }
          }
          else {
            bVar2 = 0;
          }
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_70 != (QArrayData *)0x0) {
            LOCK();
            (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_70,2,0x10);
            }
          }
          if (bVar2 != 0) {
            QtPrivate::QMovableArrayOps<QSslCipher>::emplace<QSslCipher_const&>
                      ((QMovableArrayOps<QSslCipher> *)ciphers,(ciphers->d).size,
                       (QSslCipher *)&local_40);
            QList<QSslCipher>::end(ciphers);
            iVar4 = QSslCipher::usedBits();
            if (0x7f < iVar4) {
              QtPrivate::QMovableArrayOps<QSslCipher>::emplace<QSslCipher_const&>
                        ((QMovableArrayOps<QSslCipher> *)defaultCiphers,(defaultCiphers->d).size,
                         (QSslCipher *)&local_40);
              QList<QSslCipher>::end(defaultCiphers);
            }
          }
        }
        QSslCipher::~QSslCipher((QSslCipher *)&local_40);
      }
      iVar3 = iVar3 + 1;
      iVar4 = q_OPENSSL_sk_num((OPENSSL_STACK *)a);
    } while (iVar3 < iVar4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void q_loadCiphersForConnection(SSL *connection, QList<QSslCipher> &ciphers,
                                       QList<QSslCipher> &defaultCiphers)
{
    Q_ASSERT(connection);

    STACK_OF(SSL_CIPHER) *supportedCiphers = q_SSL_get_ciphers(connection);
    for (int i = 0; i < q_sk_SSL_CIPHER_num(supportedCiphers); ++i) {
        if (SSL_CIPHER *cipher = q_sk_SSL_CIPHER_value(supportedCiphers, i)) {
            const auto ciph = QTlsBackendOpenSSL::qt_OpenSSL_cipher_to_QSslCipher(cipher);
            if (!ciph.isNull()) {
                // Unconditionally exclude ADH and AECDH ciphers since they offer no MITM protection
                if (!ciph.name().toLower().startsWith("adh"_L1) &&
                    !ciph.name().toLower().startsWith("exp-adh"_L1) &&
                    !ciph.name().toLower().startsWith("aecdh"_L1)) {
                    ciphers << ciph;

                    if (ciph.usedBits() >= 128)
                        defaultCiphers << ciph;
                }
            }
        }
    }
}